

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::anon_unknown_4::uploadBufferData
               (Functions *gl,deUint32 buffer,deUint32 usage,VertexBufferLayout *layout,
               VertexArrayPointer *srcArrays)

{
  int iVar1;
  glBufferDataFunc p_Var2;
  GLenum err;
  size_type sVar3;
  reference pvVar4;
  const_reference dstVA;
  int local_58;
  int attrNdx;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> localBuf;
  VertexArrayPointer *srcArrays_local;
  VertexBufferLayout *layout_local;
  deUint32 usage_local;
  deUint32 buffer_local;
  Functions *gl_local;
  
  iVar1 = layout->size;
  localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)srcArrays;
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,(long)iVar1,&local_41
            );
  std::allocator<unsigned_char>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    sVar3 = std::
            vector<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ::size(&layout->attributes);
    if ((int)sVar3 <= local_58) break;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    dstVA = std::
            vector<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ::operator[](&layout->attributes,(long)local_58);
    copyToLayout(pvVar4,dstVA,
                 (VertexArrayPointer *)
                 (localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage + (long)local_58 * 0x20));
    local_58 = local_58 + 1;
  }
  (*gl->bindBuffer)(0x8892,buffer);
  p_Var2 = gl->bufferData;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  (*p_Var2)(0x8892,(long)(int)sVar3,pvVar4,usage);
  (*gl->bindBuffer)(0x8892,0);
  err = (*gl->getError)();
  checkError(err,"Uploading buffer data failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
             ,0x14e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void uploadBufferData (const glw::Functions& gl, deUint32 buffer, deUint32 usage, const VertexBufferLayout& layout, const VertexArrayPointer* srcArrays)
{
	// Create temporary data buffer for upload.
	std::vector<deUint8> localBuf(layout.size);

	for (int attrNdx = 0; attrNdx < (int)layout.attributes.size(); ++attrNdx)
		copyToLayout(&localBuf[0], layout.attributes[attrNdx], srcArrays[attrNdx]);

	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)localBuf.size(), &localBuf[0], usage);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading buffer data failed");
}